

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O2

GeometryShaderOutputType sglr::rr_util::mapGLGeometryShaderOutputType(deUint32 primitive)

{
  if (primitive < 6) {
    return *(GeometryShaderOutputType *)(&DAT_005eec4c + (ulong)primitive * 4);
  }
  return GEOMETRYSHADEROUTPUTTYPE_LAST;
}

Assistant:

rr::GeometryShaderOutputType mapGLGeometryShaderOutputType (deUint32 primitive)
{
	switch (primitive)
	{
		case GL_POINTS:				return rr::GEOMETRYSHADEROUTPUTTYPE_POINTS;
		case GL_LINE_STRIP:			return rr::GEOMETRYSHADEROUTPUTTYPE_LINE_STRIP;
		case GL_TRIANGLE_STRIP:		return rr::GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP;
		default:
			DE_ASSERT(DE_FALSE);
			return rr::GEOMETRYSHADEROUTPUTTYPE_LAST;
	}
}